

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void duckdb_fmt::v6::internal::report_error(format_func func,int error_code,string_view message)

{
  memory_buffer full_message;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_218;
  
  local_218.super_buffer<char>.ptr_ = local_218.store_;
  local_218.super_buffer<char>.size_ = 0;
  local_218.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_017752b0;
  local_218.super_buffer<char>.capacity_ = 500;
  (*func)(&local_218.super_buffer<char>,error_code,message);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_218);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  /*// R does not allow us to have a reference to stderr even if we are not using it
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
  */
}